

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerMSL::cast_to_variable_store
          (CompilerMSL *this,uint32_t target_id,string *expr,SPIRType *expr_type)

{
  uint uVar1;
  byte bVar2;
  bool bVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  SPIRVariable *var;
  SPIRType *pSVar6;
  SPIRType *parent_type;
  BaseType BVar7;
  string *this_00;
  char (*in_R9) [2];
  undefined7 in_stack_fffffffffffffe18;
  string local_1d8;
  string local_1b8;
  SPIRExpression *local_198;
  SPIRType short_type;
  
  bVar2 = Compiler::has_extended_decoration
                    ((Compiler *)this,target_id,SPIRVCrossDecorationPhysicalTypePacked);
  local_198 = Compiler::maybe_get<spirv_cross::SPIRExpression>((Compiler *)this,target_id);
  var = Compiler::maybe_get_backing_variable((Compiler *)this,target_id);
  uVar4 = Compiler::get_extended_decoration
                    ((Compiler *)this,target_id,SPIRVCrossDecorationPhysicalTypeID);
  pSVar6 = expr_type;
  if (uVar4 != 0) {
    pSVar6 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar4);
  }
  if (var != (SPIRVariable *)0x0) {
    target_id = (var->super_IVariant).self.id;
    parent_type = Compiler::get_variable_data_type((Compiler *)this,var);
    if ((expr_type->basetype == Boolean) &&
       ((var->storage == StorageClassWorkgroup || (parent_type->basetype == Struct)))) {
      bVar3 = Compiler::is_array((Compiler *)this,expr_type);
      if (bVar3) {
        CompilerGLSL::to_rerolled_array_expression
                  ((string *)&short_type,&this->super_CompilerGLSL,parent_type,expr,expr_type);
        ::std::__cxx11::string::operator=((string *)expr,(string *)&short_type);
        ::std::__cxx11::string::~string((string *)&short_type);
      }
      else {
        SPIRType::SPIRType(&short_type,expr_type);
        short_type.basetype = Short;
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (&local_1d8,this,&short_type,0);
        join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                  (&local_1b8,(spirv_cross *)&local_1d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x29618e,
                   (char (*) [2])expr,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x27e75d,
                   in_R9);
        ::std::__cxx11::string::operator=((string *)expr,(string *)&local_1b8);
        ::std::__cxx11::string::~string((string *)&local_1b8);
        ::std::__cxx11::string::~string((string *)&local_1d8);
        SPIRType::~SPIRType(&short_type);
      }
    }
    if ((var != (SPIRVariable *)0x0) && ((this->msl_options).msl_version < 30000)) {
      if (var->storage == StorageClassWorkgroup) {
        uVar1 = expr_type->columns;
      }
      else {
        if (((parent_type->basetype != Struct) ||
            (bVar3 = Compiler::has_extended_decoration
                               ((Compiler *)this,(parent_type->super_IVariant).self.id,
                                SPIRVCrossDecorationWorkgroupStruct), !bVar3)) ||
           (bVar2 = bVar2 ^ 1, bVar2 == 0)) goto LAB_001fea76;
        uVar1 = expr_type->columns;
      }
      if (1 < uVar1) {
        SPIRType::SPIRType(&short_type,pSVar6);
        if ((local_198 != (SPIRExpression *)0x0) && (local_198->need_transpose == true)) {
          uVar4 = short_type.columns;
          short_type.columns = short_type.vecsize;
          short_type.vecsize = uVar4;
        }
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (&local_1d8,this,&short_type,0);
        in_R9 = (char (*) [2])0x27e75d;
        join<char_const(&)[12],std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                  (&local_1b8,(spirv_cross *)"spvStorage_",(char (*) [12])&local_1d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x29618e,
                   (char (*) [2])expr,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x27e75d,
                   (char (*) [2])CONCAT17(bVar2,in_stack_fffffffffffffe18));
        ::std::__cxx11::string::operator=((string *)expr,(string *)&local_1b8);
        ::std::__cxx11::string::~string((string *)&local_1b8);
        ::std::__cxx11::string::~string((string *)&local_1d8);
        SPIRType::~SPIRType(&short_type);
      }
    }
  }
LAB_001fea76:
  bVar3 = Compiler::has_decoration((Compiler *)this,(ID)target_id,DecorationBuiltIn);
  if (!bVar3) {
    return;
  }
  uVar5 = Compiler::get_decoration((Compiler *)this,(ID)target_id,DecorationBuiltIn);
  uVar4 = 0x20;
  BVar7 = UInt;
  if (uVar5 < 0xd) {
    if ((0x680U >> (uVar5 & 0x1f) & 1) != 0) goto LAB_001feadb;
    if ((0x1800U >> (uVar5 & 0x1f) & 1) != 0) {
      uVar4 = 0x10;
      BVar7 = Half;
      goto LAB_001feadb;
    }
  }
  if ((uVar5 != 0x1158) && (uVar5 != 0x1396)) {
    return;
  }
LAB_001feadb:
  if (BVar7 != expr_type->basetype) {
    if (uVar4 == expr_type->width) {
      SPIRType::SPIRType(&short_type,expr_type);
      short_type.basetype = BVar7;
      CompilerGLSL::bitcast_expression
                (&local_1b8,&this->super_CompilerGLSL,&short_type,expr_type->basetype,expr);
      this_00 = &local_1b8;
      ::std::__cxx11::string::operator=((string *)expr,(string *)this_00);
    }
    else {
      SPIRType::SPIRType(&short_type,expr_type);
      short_type.basetype = BVar7;
      short_type.width = uVar4;
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                (&local_1d8,this,&short_type,0);
      join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                (&local_1b8,(spirv_cross *)&local_1d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x29618e,
                 (char (*) [2])expr,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x27e75d,in_R9
                );
      ::std::__cxx11::string::operator=((string *)expr,(string *)&local_1b8);
      ::std::__cxx11::string::~string((string *)&local_1b8);
      this_00 = &local_1d8;
    }
    ::std::__cxx11::string::~string((string *)this_00);
    SPIRType::~SPIRType(&short_type);
  }
  return;
}

Assistant:

void CompilerMSL::cast_to_variable_store(uint32_t target_id, std::string &expr, const SPIRType &expr_type)
{
	bool is_packed = has_extended_decoration(target_id, SPIRVCrossDecorationPhysicalTypePacked);
	auto *target_expr = maybe_get<SPIRExpression>(target_id);
	auto *var = maybe_get_backing_variable(target_id);
	const SPIRType *var_type = nullptr, *phys_type = nullptr;

	if (uint32_t phys_id = get_extended_decoration(target_id, SPIRVCrossDecorationPhysicalTypeID))
		phys_type = &get<SPIRType>(phys_id);
	else
		phys_type = &expr_type;

	if (var)
	{
		target_id = var->self;
		var_type = &get_variable_data_type(*var);
	}

	bool rewrite_boolean_store =
		expr_type.basetype == SPIRType::Boolean &&
		(var && (var->storage == StorageClassWorkgroup || var_type->basetype == SPIRType::Struct));

	// Type fixups for workgroup variables or struct members if they are booleans.
	if (rewrite_boolean_store)
	{
		if (is_array(expr_type))
		{
			expr = to_rerolled_array_expression(*var_type, expr, expr_type);
		}
		else
		{
			auto short_type = expr_type;
			short_type.basetype = SPIRType::Short;
			expr = join(type_to_glsl(short_type), "(", expr, ")");
		}
	}

	// Type fixups for workgroup variables if they are matrices.
	// Don't do fixup for packed types; those are handled specially.
	// FIXME: Maybe use a type like spvStorageMatrix for packed matrices?
	if (!msl_options.supports_msl_version(3, 0) && var &&
	    (var->storage == StorageClassWorkgroup ||
	     (var_type->basetype == SPIRType::Struct &&
	      has_extended_decoration(var_type->self, SPIRVCrossDecorationWorkgroupStruct) && !is_packed)) &&
	    expr_type.columns > 1)
	{
		SPIRType matrix_type = *phys_type;
		if (target_expr && target_expr->need_transpose)
			swap(matrix_type.vecsize, matrix_type.columns);
		expr = join("spvStorage_", type_to_glsl(matrix_type), "(", expr, ")");
	}

	// Only interested in standalone builtin variables.
	if (!has_decoration(target_id, DecorationBuiltIn))
		return;

	auto builtin = static_cast<BuiltIn>(get_decoration(target_id, DecorationBuiltIn));
	auto expected_type = expr_type.basetype;
	auto expected_width = expr_type.width;
	switch (builtin)
	{
	case BuiltInLayer:
	case BuiltInViewportIndex:
	case BuiltInFragStencilRefEXT:
	case BuiltInPrimitiveId:
	case BuiltInViewIndex:
		expected_type = SPIRType::UInt;
		expected_width = 32;
		break;

	case BuiltInTessLevelInner:
	case BuiltInTessLevelOuter:
		expected_type = SPIRType::Half;
		expected_width = 16;
		break;

	default:
		break;
	}

	if (expected_type != expr_type.basetype)
	{
		if (expected_width != expr_type.width)
		{
			// These are of different widths, so we cannot do a straight bitcast.
			auto type = expr_type;
			type.basetype = expected_type;
			type.width = expected_width;
			expr = join(type_to_glsl(type), "(", expr, ")");
		}
		else
		{
			auto type = expr_type;
			type.basetype = expected_type;
			expr = bitcast_expression(type, expr_type.basetype, expr);
		}
	}
}